

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

void * yang_read_when(lys_module *module,lys_node *node,yytokentype type,char *value)

{
  char *pcVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  
  pcVar1 = (char *)calloc(1,0x28);
  if (pcVar1 == (char *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    pcVar1 = (char *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_when");
    goto LAB_0014ca79;
  }
  pcVar2 = transform_schema2json(module,value);
  *(char **)pcVar1 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    if ((int)type < 0x12f) {
      switch(type) {
      case AUGMENT_KEYWORD:
        if (node->next == (lys_node *)0x0) {
          node = (lys_node *)&node->next;
LAB_0014ca76:
          node->name = pcVar1;
          goto LAB_0014ca79;
        }
        pcVar2 = "augment";
        break;
      case BASE_KEYWORD:
      case BELONGS_TO_KEYWORD:
      case BIT_KEYWORD:
      case CONFIG_KEYWORD:
      case CONTACT_KEYWORD:
        goto switchD_0014c8fc_caseD_115;
      case CASE_KEYWORD:
        if (node[1].name == (char *)0x0) {
LAB_0014ca72:
          node = node + 1;
          goto LAB_0014ca76;
        }
        pcVar2 = "case";
        break;
      case CHOICE_KEYWORD:
        if (node[1].name == (char *)0x0) goto LAB_0014ca72;
        pcVar2 = "choice";
        break;
      case CONTAINER_KEYWORD:
        if (node[1].name == (char *)0x0) goto LAB_0014ca72;
        pcVar2 = "container";
        break;
      default:
        if (type == ANYXML_KEYWORD) {
LAB_0014c9c7:
          if (node[1].name == (char *)0x0) goto LAB_0014ca72;
          pcVar2 = "anydata";
          if (type == ANYXML_KEYWORD) {
            pcVar2 = "anyxml";
          }
        }
        else {
          if (type != LEAF_KEYWORD) goto switchD_0014c8fc_caseD_115;
          if (node[1].name == (char *)0x0) goto LAB_0014ca72;
          pcVar2 = "leaf";
        }
      }
    }
    else if ((int)type < 0x14e) {
      if (type == LEAF_LIST_KEYWORD) {
        if (node[1].name == (char *)0x0) goto LAB_0014ca72;
        pcVar2 = "leaflist";
      }
      else {
        if (type != LIST_KEYWORD) goto switchD_0014c8fc_caseD_115;
        if (node[1].name == (char *)0x0) goto LAB_0014ca72;
        pcVar2 = "list";
      }
    }
    else {
      if (type != USES_KEYWORD) {
        if (type == ANYDATA_KEYWORD) goto LAB_0014c9c7;
        if (type == EXTENSION_INSTANCE) goto LAB_0014ca76;
        goto switchD_0014c8fc_caseD_115;
      }
      if (node[1].name == (char *)0x0) goto LAB_0014ca72;
      pcVar2 = "uses";
    }
    ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when",pcVar2);
  }
switchD_0014c8fc_caseD_115:
  free(value);
  lydict_remove(module->ctx,*(char **)pcVar1);
  value = pcVar1;
  pcVar1 = (char *)0x0;
LAB_0014ca79:
  free(value);
  return pcVar1;
}

Assistant:

void *
yang_read_when(struct lys_module *module, struct lys_node *node, enum yytokentype type, char *value)
{
    struct lys_when *retval;

    retval = calloc(1, sizeof *retval);
    if (!retval) {
        LOGMEM;
        free(value);
        return NULL;
    }
    retval->cond = transform_schema2json(module, value);
    if (!retval->cond) {
        goto error;
    }
    switch (type) {
    case CONTAINER_KEYWORD:
        if (((struct lys_node_container *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "container");
            goto error;
        }
        ((struct lys_node_container *)node)->when = retval;
        break;
    case ANYDATA_KEYWORD:
    case ANYXML_KEYWORD:
        if (((struct lys_node_anydata *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", (type == ANYXML_KEYWORD) ? "anyxml" : "anydata");
            goto error;
        }
        ((struct lys_node_anydata *)node)->when = retval;
        break;
    case CHOICE_KEYWORD:
        if (((struct lys_node_choice *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "choice");
            goto error;
        }
        ((struct lys_node_choice *)node)->when = retval;
        break;
    case CASE_KEYWORD:
        if (((struct lys_node_case *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "case");
            goto error;
        }
        ((struct lys_node_case *)node)->when = retval;
        break;
    case LEAF_KEYWORD:
        if (((struct lys_node_leaf *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "leaf");
            goto error;
        }
        ((struct lys_node_leaf *)node)->when = retval;
        break;
    case LEAF_LIST_KEYWORD:
        if (((struct lys_node_leaflist *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "leaflist");
            goto error;
        }
        ((struct lys_node_leaflist *)node)->when = retval;
        break;
    case LIST_KEYWORD:
        if (((struct lys_node_list *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "list");
            goto error;
        }
        ((struct lys_node_list *)node)->when = retval;
        break;
    case USES_KEYWORD:
        if (((struct lys_node_uses *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "uses");
            goto error;
        }
        ((struct lys_node_uses *)node)->when = retval;
        break;
    case AUGMENT_KEYWORD:
        if (((struct lys_node_augment *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "augment");
            goto error;
        }
        ((struct lys_node_augment *)node)->when = retval;
        break;
    case EXTENSION_INSTANCE:
        *(struct lys_when **)node = retval;
        break;
    default:
        goto error;
        break;
    }
    free(value);
    return retval;

error:
    free(value);
    lydict_remove(module->ctx, retval->cond);
    free(retval);
    return NULL;
}